

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gdfx.c
# Opt level: O2

char * gdImageStringFTCircle
                 (gdImagePtr im,int cx,int cy,double radius,double textRadius,double fillPortion,
                 char *font,double points,char *top,char *bottom,int fgcolor)

{
  int iVar1;
  ulong uVar2;
  int *piVar3;
  int *piVar4;
  uint uVar5;
  gdImagePtr im_00;
  gdImagePtr dst;
  gdImagePtr pgVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  long lVar13;
  int iVar14;
  uint uVar15;
  int iVar16;
  int iVar17;
  long lVar18;
  double dVar19;
  uint local_c0;
  char *local_b0;
  int brect [8];
  
  dVar19 = points * 4.0;
  local_b0 = gdImageStringFT((gdImage *)0x0,brect,0,font,dVar19,0.0,0,0,bottom);
  iVar17 = brect[7];
  iVar11 = brect[5];
  iVar8 = brect[3];
  iVar16 = brect[1];
  if (local_b0 == (char *)0x0) {
    iVar7 = brect[6];
    if (brect[6] < brect[4]) {
      iVar7 = brect[4];
    }
    iVar12 = brect[6];
    if (brect[4] < brect[6]) {
      iVar12 = brect[4];
    }
    iVar14 = brect[2];
    if (brect[2] < brect[0]) {
      iVar14 = brect[0];
    }
    iVar1 = brect[2];
    if (brect[0] < brect[2]) {
      iVar1 = brect[0];
    }
    if (iVar14 <= iVar7) {
      iVar14 = iVar7;
    }
    if (iVar12 <= iVar1) {
      iVar1 = iVar12;
    }
    local_b0 = gdImageStringFT((gdImage *)0x0,brect,0,font,dVar19,0.0,0,0,top);
    if (local_b0 == (char *)0x0) {
      uVar15 = iVar14 - iVar1;
      iVar7 = iVar17;
      if (iVar17 < iVar11) {
        iVar7 = iVar11;
      }
      if (iVar11 < iVar17) {
        iVar17 = iVar11;
      }
      iVar11 = iVar8;
      if (iVar8 < iVar16) {
        iVar11 = iVar16;
      }
      if (iVar16 < iVar8) {
        iVar8 = iVar16;
      }
      if (iVar11 <= iVar7) {
        iVar11 = iVar7;
      }
      if (iVar17 <= iVar8) {
        iVar8 = iVar17;
      }
      iVar17 = brect[6];
      if (brect[6] < brect[4]) {
        iVar17 = brect[4];
      }
      if (brect[4] < brect[6]) {
        brect[6] = brect[4];
      }
      iVar16 = brect[2];
      if (brect[2] < brect[0]) {
        iVar16 = brect[0];
      }
      if (brect[0] < brect[2]) {
        brect[2] = brect[0];
      }
      if (iVar16 <= iVar17) {
        iVar16 = iVar17;
      }
      if (brect[6] <= brect[2]) {
        brect[2] = brect[6];
      }
      uVar10 = iVar16 - brect[2];
      iVar17 = brect[7];
      if (brect[7] < brect[5]) {
        iVar17 = brect[5];
      }
      if (brect[5] < brect[7]) {
        brect[7] = brect[5];
      }
      iVar16 = brect[3];
      if (brect[3] < brect[1]) {
        iVar16 = brect[1];
      }
      if (brect[1] < brect[3]) {
        brect[3] = brect[1];
      }
      if (iVar16 <= iVar17) {
        iVar16 = iVar17;
      }
      if (brect[7] <= brect[3]) {
        brect[3] = brect[7];
      }
      iVar17 = uVar10 + 6;
      if ((int)uVar10 < (int)uVar15) {
        iVar17 = uVar15 + 6;
      }
      iVar7 = iVar17 * 2 + 4;
      uVar5 = iVar16 - brect[3];
      if (iVar16 - brect[3] < iVar11 - iVar8) {
        uVar5 = iVar11 - iVar8;
      }
      iVar8 = uVar5 + 6;
      im_00 = gdImageCreateTrueColor(iVar7,iVar8);
      if (im_00 == (gdImagePtr)0x0) {
        local_b0 = "could not create first image";
      }
      else {
        iVar16 = iVar7 >> 1;
        local_b0 = gdImageStringFT(im_00,(int *)0x0,0xffffff,font,dVar19,0.0,
                                   (int)(iVar16 - (uVar15 + 6)) / 2,(int)dVar19,bottom);
        if ((local_b0 == (char *)0x0) &&
           (local_b0 = gdImageStringFT(im_00,(int *)0x0,0xffffff,font,dVar19,0.0,
                                       (int)(iVar16 - (uVar10 + 6)) / 2 + iVar16,(int)dVar19,top),
           local_b0 == (char *)0x0)) {
          iVar17 = iVar17 * 2 + 2;
          if ((uVar5 & 1) == 0) {
            uVar2 = (ulong)uVar15;
            if ((int)uVar15 < (int)uVar10) {
              uVar2 = (ulong)uVar10;
            }
            uVar9 = 0;
            uVar15 = iVar8 >> 1;
            if (iVar8 >> 1 < 1) {
              uVar15 = 0;
            }
            for (; uVar9 != uVar15; uVar9 = uVar9 + 1) {
              iVar11 = ((iVar16 + (int)uVar2 * 2) - ((int)uVar2 * 2 + 0x10 >> 1)) + 0xe;
              for (lVar13 = ((long)((uVar2 << 0x21) + 0x1000000000) >> 0x21) + 2; lVar13 < iVar17;
                  lVar13 = lVar13 + 1) {
                piVar3 = im_00->tpixels[(int)(~(uint)uVar9 + iVar8)];
                iVar12 = piVar3[(long)iVar11 + -1];
                piVar4 = im_00->tpixels[uVar9];
                piVar3[(long)iVar11 + -1] = piVar4[lVar13];
                piVar4[lVar13] = iVar12;
                iVar11 = iVar11 + -1;
              }
            }
          }
          else {
            uVar2 = (ulong)uVar15;
            if ((int)uVar15 < (int)uVar10) {
              uVar2 = (ulong)uVar10;
            }
            iVar12 = (int)((long)iVar8 / 2);
            iVar11 = -1;
            if (-1 < iVar12) {
              iVar11 = iVar12;
            }
            for (uVar9 = 0; uVar9 != iVar11 + 1; uVar9 = uVar9 + 1) {
              iVar12 = 0;
              if (uVar9 == ((long)iVar8 / 2 & 0xffffffffU)) {
                iVar12 = iVar7 / -4;
              }
              iVar14 = ((iVar16 + (int)uVar2 * 2) - ((int)uVar2 * 2 + 0x10 >> 1)) + 0xe;
              for (lVar13 = ((long)((uVar2 << 0x21) + 0x1000000000) >> 0x21) + 2;
                  lVar13 < iVar12 + iVar17; lVar13 = lVar13 + 1) {
                piVar3 = im_00->tpixels[(int)(~(uint)uVar9 + iVar8)];
                iVar1 = piVar3[(long)iVar14 + -1];
                piVar4 = im_00->tpixels[uVar9];
                piVar3[(long)iVar14 + -1] = piVar4[lVar13];
                piVar4[lVar13] = iVar1;
                iVar14 = iVar14 + -1;
              }
            }
          }
          iVar8 = iVar8 * 10;
          if (iVar7 <= iVar8) {
            iVar7 = iVar8;
          }
          dst = gdImageCreateTrueColor(iVar7,iVar7);
          if (dst == (gdImagePtr)0x0) {
            local_b0 = "could not create resampled image";
          }
          else {
            iVar16 = (int)((1.0 - textRadius / radius) * (double)iVar8);
            iVar17 = (int)((textRadius / radius) * (double)iVar8);
            local_b0 = (char *)0x0;
            gdImageCopyResampled
                      (dst,im_00,(int)((1.0 - fillPortion) * (double)dst->sx * 0.25),iVar16,0,0,
                       (int)((double)dst->sx * fillPortion * 0.5),iVar17,im_00->sx / 2,im_00->sy);
            dVar19 = (double)dst->sx;
            iVar8 = im_00->sx / 2;
            gdImageCopyResampled
                      (dst,im_00,(int)((1.0 - fillPortion) * dVar19 * 0.25 + (double)(dst->sx / 2)),
                       iVar16,iVar8,0,(int)(dVar19 * fillPortion * 0.5),iVar17,iVar8,im_00->sy);
            pgVar6 = gdImageSquareToCircle(dst,(int)radius);
            gdImageDestroy(im_00);
            gdImageDestroy(dst);
            iVar17 = pgVar6->sx;
            iVar8 = pgVar6->sy;
            iVar11 = iVar17 / -2;
            iVar16 = iVar8 / -2;
            local_c0 = (uint)~fgcolor >> 0x18 & 0x7f;
            for (lVar13 = 0; im_00 = pgVar6, lVar13 < iVar8; lVar13 = lVar13 + 1) {
              for (lVar18 = 0; lVar18 < iVar17; lVar18 = lVar18 + 1) {
                gdImageSetPixel(im,iVar11 + cx + (int)lVar18,iVar16 + cy + (int)lVar13,
                                (fgcolor & 0xffffffU | 0x7f000000) +
                                ((((uint)pgVar6->tpixels[lVar13][lVar18] >> 0x11 & 0x7f) * local_c0)
                                / 0x7f) * -0x1000000);
                iVar17 = pgVar6->sx;
              }
              iVar8 = pgVar6->sy;
            }
          }
        }
        gdImageDestroy(im_00);
      }
    }
  }
  return local_b0;
}

Assistant:

BGD_DECLARE(char *)
gdImageStringFTCircle (gdImagePtr im,
                       int cx,
                       int cy,
                       double radius,
                       double textRadius,
                       double fillPortion,
                       char *font,
                       double points, char *top, char *bottom, int fgcolor)
{
	char *err;
	int w;
	int brect[8];
	int sx1, sx2, sy1, sy2, sx, sy;
	int x, y;
	int fr, fg, fb, fa;
	int ox, oy;
	double prop;
	gdImagePtr im1;
	gdImagePtr im2;
	gdImagePtr im3;
	/* obtain brect so that we can size the image */
	err = gdImageStringFT ((gdImagePtr) NULL,
	                       &brect[0], 0, font, points * MAG, 0, 0, 0, bottom);
	if (err) {
		return err;
	}
	sx1 = MAXX (brect) - MINX (brect) + 6;
	sy1 = MAXY (brect) - MINY (brect) + 6;
	err = gdImageStringFT ((gdImagePtr) NULL,
	                       &brect[0], 0, font, points * MAG, 0, 0, 0, top);
	if (err) {
		return err;
	}
	sx2 = MAXX (brect) - MINX (brect) + 6;
	sy2 = MAXY (brect) - MINY (brect) + 6;
	/* Pad by 4 pixels to allow for slight errors
	   observed in the bounding box returned by freetype */
	if (sx1 > sx2) {
		sx = sx1 * 2 + 4;
	} else {
		sx = sx2 * 2 + 4;
	}
	if (sy1 > sy2) {
		sy = sy1;
	} else {
		sy = sy2;
	}
	im1 = gdImageCreateTrueColor (sx, sy);
	if (!im1) {
		return "could not create first image";
	}
	err = gdImageStringFT (im1, 0, gdTrueColor (255, 255, 255),
	                       font, points * MAG,
	                       0, ((sx / 2) - sx1) / 2, points * MAG, bottom);
	if (err) {
		gdImageDestroy (im1);
		return err;
	}
	/* We don't know the descent, which would be needed to do this
	   with the angle parameter. Instead, implement a simple
	   flip operation ourselves. */
	err = gdImageStringFT (im1, 0, gdTrueColor (255, 255, 255),
	                       font, points * MAG,
	                       0, sx / 2 + ((sx / 2) - sx2) / 2, points * MAG, top);
	if (err) {
		gdImageDestroy (im1);
		return err;
	}
	/* Flip in place is tricky, be careful not to double-swap things */
	if (sy & 1) {
		for (y = 0; (y <= (sy / 2)); y++) {
			int xlimit = sx - 2;
			if (y == (sy / 2)) {
				/* If there is a "middle" row, be careful
				   not to swap twice! */
				xlimit -= (sx / 4);
			}
			for (x = (sx / 2) + 2; (x < xlimit); x++) {
				int t;
				int ox = sx - x + (sx / 2) - 1;
				int oy = sy - y - 1;
				t = im1->tpixels[oy][ox];
				im1->tpixels[oy][ox] = im1->tpixels[y][x];
				im1->tpixels[y][x] = t;
			}
		}
	} else {
		for (y = 0; (y < (sy / 2)); y++) {
			int xlimit = sx - 2;
			for (x = (sx / 2) + 2; (x < xlimit); x++) {
				int t;
				int ox = sx - x + (sx / 2) - 1;
				int oy = sy - y - 1;
				t = im1->tpixels[oy][ox];
				im1->tpixels[oy][ox] = im1->tpixels[y][x];
				im1->tpixels[y][x] = t;
			}
		}
	}
#if STEP_PNGS
	{
		FILE *out = fopen ("gdfx1.png", "wb");
		gdImagePng (im1, out);
		fclose (out);
	}
#endif /* STEP_PNGS */
	/* Resample taller; the exact proportions of the text depend on the
	   ratio of textRadius to radius, and the value of fillPortion */
	if (sx > sy * 10) {
		w = sx;
	} else {
		w = sy * 10;
	}
	im2 = gdImageCreateTrueColor (w, w);
	if (!im2) {
		gdImageDestroy (im1);
		return "could not create resampled image";
	}
	prop = textRadius / radius;
	gdImageCopyResampled (im2, im1,
	                      gdImageSX (im2) * (1.0 - fillPortion) / 4,
	                      sy * 10 * (1.0 - prop),
	                      0, 0,
	                      gdImageSX (im2) * fillPortion / 2, sy * 10 * prop,
	                      gdImageSX (im1) / 2, gdImageSY (im1));
	gdImageCopyResampled (im2, im1,
	                      (gdImageSX (im2) / 2) +
	                      gdImageSX (im2) * (1.0 - fillPortion) / 4,
	                      sy * 10 * (1.0 - prop),
	                      gdImageSX (im1) / 2, 0,
	                      gdImageSX (im2) * fillPortion / 2, sy * 10 * prop,
	                      gdImageSX (im1) / 2, gdImageSY (im1));
#if STEP_PNGS
	{
		FILE *out = fopen ("gdfx2.png", "wb");
		gdImagePng (im2, out);
		fclose (out);
	}
#endif /* STEP_PNGS */
	/* Ready to produce a circle */
	im3 = gdImageSquareToCircle (im2, radius);
	gdImageDestroy (im1);
	gdImageDestroy (im2);
	/* Now blend im3 with the destination. Cheat a little. The
	   source (im3) is white-on-black, so we can use the
	   red component as a basis for alpha as long as we're
	   careful to shift off the extra bit and invert
	   (alpha ranges from 0 to 127 where 0 is OPAQUE).
	   Also be careful to allow for an alpha component
	   in the fgcolor parameter itself (gug!) */
	fr = gdTrueColorGetRed (fgcolor);
	fg = gdTrueColorGetGreen (fgcolor);
	fb = gdTrueColorGetBlue (fgcolor);
	fa = gdTrueColorGetAlpha (fgcolor);
	ox = cx - (im3->sx / 2);
	oy = cy - (im3->sy / 2);
	for (y = 0; (y < im3->sy); y++) {
		for (x = 0; (x < im3->sx); x++) {
			int a = gdTrueColorGetRed (im3->tpixels[y][x]) >> 1;
			a *= (127 - fa);
			a /= 127;
			a = 127 - a;
			gdImageSetPixel (im, x + ox, y + oy,
			                 gdTrueColorAlpha (fr, fg, fb, a));
		}
	}
	gdImageDestroy (im3);
	return 0;
}